

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O3

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  DataType *pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppaVar2;
  ulong __n;
  __uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_> _Var3;
  int iVar4;
  undefined4 uVar5;
  Object *pOVar6;
  long lVar7;
  IfcPresentationStyleAssignment *pIVar8;
  tuple<aiMaterial_*,_std::default_delete<aiMaterial>_> this_01;
  char *__src;
  IfcSurfaceStyleShading *pIVar9;
  IfcColourRgb *in;
  long *plVar10;
  mapped_type *pmVar11;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var12;
  aiMaterial *this_02;
  undefined7 in_register_00000009;
  undefined8 *puVar13;
  _Base_ptr p_Var14;
  size_type *psVar15;
  uint uVar16;
  ulong unaff_RBX;
  pointer psVar17;
  pointer ppaVar18;
  undefined4 in_register_00000034;
  _Rb_tree_header *p_Var19;
  _Base_ptr p_Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  IfcSurfaceStyle *pIVar21;
  bool bVar22;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar23;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat_1;
  aiColor4D col;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  int shading;
  IfcSurfaceStyle *surf;
  string side;
  aiColor4D col_base;
  float t;
  aiString name;
  __uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_> local_950;
  aiColor4D local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  undefined4 local_918;
  undefined4 local_914;
  _Rb_tree_header *local_910;
  IfcSurfaceStyle *local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  ulong local_8c0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_8b8;
  undefined8 *local_8b0;
  _Base_ptr local_8a8;
  undefined8 *local_8a0;
  MaterialCache *local_898;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_890;
  undefined8 *local_888;
  IfcSurfaceStyle *local_880;
  undefined8 *local_878;
  pointer local_870;
  aiColor4D local_868;
  uint64_t local_850;
  undefined1 local_848 [112];
  ios_base local_7d8 [928];
  aiString local_438;
  
  local_8c0 = CONCAT44(in_register_00000034,prevMatId);
  local_918 = (undefined4)CONCAT71(in_register_00000009,forceDefaultMat);
  local_850 = id;
  pVar23 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(&(conv->db->refs)._M_t,&local_850);
  local_8b8 = pVar23.second._M_node;
  if (pVar23.first._M_node._M_node != local_8b8._M_node) {
    local_898 = &conv->cached_materials;
    local_910 = &(conv->cached_materials)._M_t._M_impl.super__Rb_tree_header;
    local_890 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials;
    do {
      local_8b8 = pVar23.second._M_node;
      local_8a8 = (_Base_ptr)pVar23.first._M_node;
      p_Var14 = (conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var20 = &(conv->db->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        bVar22 = *(_Base_ptr *)(p_Var14 + 1) < local_8a8[1]._M_parent;
        if (!bVar22) {
          p_Var20 = p_Var14;
        }
        p_Var14 = (&p_Var14->_M_left)[bVar22];
      } while (p_Var14 != (_Base_ptr)0x0);
      pOVar6 = STEP::LazyObject::operator*((LazyObject *)p_Var20[1]._M_parent);
      lVar7 = __dynamic_cast(pOVar6,&STEP::Object::typeinfo,&Schema_2x3::IfcStyledItem::typeinfo,
                             0xffffffffffffffff);
      if (lVar7 != 0) {
        puVar13 = *(undefined8 **)(lVar7 + 0x30);
        local_8b0 = *(undefined8 **)(lVar7 + 0x38);
        if (puVar13 != local_8b0) {
          do {
            local_8a0 = puVar13;
            pIVar8 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment>
                               ((LazyObject *)*puVar13);
            puVar13 = *(undefined8 **)
                       &(pIVar8->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x10;
            local_878 = *(undefined8 **)
                         &(pIVar8->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                          ).field_0x18;
            if (puVar13 != local_878) {
              do {
                pDVar1 = (DataType *)*puVar13;
                this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar13[1];
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this->_M_use_count = this->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this->_M_use_count = this->_M_use_count + 1;
                  }
                }
                local_908 = STEP::EXPRESS::DataType::
                            ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>
                                      (pDVar1,conv->db);
                pIVar21 = local_908;
                if (local_908 != (IfcSurfaceStyle *)0x0) {
                  p_Var14 = (conv->cached_materials)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                  p_Var19 = local_910;
                  if (p_Var14 != (_Base_ptr)0x0) {
                    do {
                      if (*(IfcSurfaceStyle **)(p_Var14 + 1) >= local_908) {
                        p_Var19 = (_Rb_tree_header *)p_Var14;
                      }
                      p_Var14 = (&p_Var14->_M_left)[*(IfcSurfaceStyle **)(p_Var14 + 1) < local_908];
                    } while (p_Var14 != (_Base_ptr)0x0);
                    if ((p_Var19 != local_910) &&
                       ((IfcSurfaceStyle *)p_Var19->_M_node_count <= local_908)) {
                      unaff_RBX = (ulong)*(uint *)(p_Var19 + 1);
                      goto LAB_005b87fd;
                    }
                  }
                  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
                  lVar7 = *(long *)&(local_908->super_IfcPresentationStyle).field_0x48;
                  local_880 = local_908;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_900,lVar7,*(long *)&local_908->field_0x50 + lVar7);
                  iVar4 = std::__cxx11::string::compare((char *)&local_900);
                  if (iVar4 != 0) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_848,
                                   "ignoring surface side marker on IFC::IfcSurfaceStyle: ",
                                   &local_900);
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_438,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_848);
                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&local_438);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                    std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
                    if ((undefined1 *)local_848._0_8_ != local_848 + 0x10) {
                      operator_delete((void *)local_848._0_8_,(ulong)(local_848._16_8_ + 1));
                    }
                  }
                  this_01.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       operator_new(0x10);
                  aiMaterial::aiMaterial
                            ((aiMaterial *)
                             this_01.
                             super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                             super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl);
                  pIVar21 = local_908;
                  local_438.length = 0;
                  local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
                  local_950._M_t.
                  super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       this_01.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
                  local_888 = puVar13;
                  memset(local_438.data + 1,0x1b,0x3ff);
                  local_848._0_8_ = local_848 + 0x10;
                  if ((pIVar21->super_IfcPresentationStyle).field_0x30 == '\x01') {
                    lVar7 = *(long *)&(pIVar21->super_IfcPresentationStyle).
                                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                      .field_0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_848,lVar7,
                               *(long *)&(pIVar21->super_IfcPresentationStyle).
                                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                         .field_0x18 + lVar7);
                    __src = (char *)local_848._0_8_;
                  }
                  else {
                    local_938._M_dataplus._M_p = (pointer)0x17;
                    __src = (char *)std::__cxx11::string::_M_create
                                              ((ulong *)local_848,(ulong)&local_938);
                    local_848._16_8_ = local_938._M_dataplus._M_p;
                    builtin_strncpy(__src,"IfcSurfaceStyle_Unnamed",0x17);
                    local_848._8_4_ = SUB84(local_938._M_dataplus._M_p,0);
                    local_848._12_4_ = (undefined4)((ulong)local_938._M_dataplus._M_p >> 0x20);
                    __src[(long)local_938._M_dataplus._M_p] = '\0';
                  }
                  __n = CONCAT44(local_848._12_4_,local_848._8_4_);
                  local_848._0_8_ = __src;
                  if (__n < 0x400) {
                    local_438.length = local_848._8_4_;
                    memcpy(local_438.data,__src,__n);
                    local_438.data[__n] = '\0';
                  }
                  if (__src != local_848 + 0x10) {
                    operator_delete(__src,(ulong)(local_848._16_8_ + 1));
                  }
                  aiMaterial::AddProperty
                            ((aiMaterial *)
                             this_01.
                             super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                             super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&local_438,
                             "?mat.name",0,0);
                  psVar17 = (pIVar21->Styles).
                            super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            .
                            super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_870 = (pIVar21->Styles).
                              super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              .
                              super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  if (psVar17 != local_870) {
                    do {
                      pDVar1 = (psVar17->
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                      this_00 = (psVar17->
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          this_00->_M_use_count = this_00->_M_use_count + 1;
                        }
                      }
                      pIVar9 = STEP::EXPRESS::DataType::
                               ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                                         (pDVar1,conv->db);
                      if (pIVar9 != (IfcSurfaceStyleShading *)0x0) {
                        local_868.r = 0.0;
                        local_868.g = 0.0;
                        local_868.b = 0.0;
                        local_868.a = 0.0;
                        local_948.r = 0.0;
                        local_948.g = 0.0;
                        local_948.b = 0.0;
                        local_948.a = 0.0;
                        in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcColourRgb>
                                       (*(LazyObject **)
                                         &(pIVar9->
                                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                          ).field_0x10);
                        ConvertColor(&local_868,in);
                        aiMaterial::AddBinaryProperty
                                  ((aiMaterial *)
                                   this_01.
                                   super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                   .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                   &local_868,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                        lVar7 = __dynamic_cast((_func_int *)
                                               ((long)&(pIVar9->
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper +
                                               (long)(pIVar9->
                                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                                  )._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                                               &Schema_2x3::IfcSurfaceStyleRendering::typeinfo,
                                               0xffffffffffffffff);
                        if (lVar7 != 0) {
                          if (*(char *)(lVar7 + 0x30) == '\x01') {
                            local_848._0_4_ = 1.0 - (float)*(double *)(lVar7 + 0x28);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_01.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       local_848,4,"$mat.opacity",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar7 + 0x48) == '\x01') {
                            ConvertColor(&local_948,*(IfcColourOrFactor **)(lVar7 + 0x38),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_01.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_948,0x10,"$clr.diffuse",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar7 + 0xa8) == '\x01') {
                            ConvertColor(&local_948,*(IfcColourOrFactor **)(lVar7 + 0x98),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_01.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_948,0x10,"$clr.specular",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar7 + 0x60) == '\x01') {
                            ConvertColor(&local_948,*(IfcColourOrFactor **)(lVar7 + 0x50),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_01.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_948,0x10,"$clr.transparent",0,0,aiPTI_Float);
                          }
                          if (*(char *)(lVar7 + 0x90) == '\x01') {
                            ConvertColor(&local_948,*(IfcColourOrFactor **)(lVar7 + 0x80),conv,
                                         &local_868);
                            aiMaterial::AddBinaryProperty
                                      ((aiMaterial *)
                                       this_01.
                                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                       .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                       &local_948,0x10,"$clr.reflective",0,0,aiPTI_Float);
                          }
                          uVar5 = 2;
                          if ((*(char *)(lVar7 + 0xc0) == '\x01') &&
                             (*(char *)(lVar7 + 0xa8) == '\x01')) {
                            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(lVar7 + 200);
                            iVar4 = std::__cxx11::string::compare((char *)__rhs);
                            if (iVar4 == 0) {
                              uVar5 = 4;
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)__rhs);
                              if (iVar4 == 0) {
                                uVar5 = 9;
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)__rhs);
                                uVar5 = 9;
                                if (iVar4 != 0) {
                                  iVar4 = std::__cxx11::string::compare((char *)__rhs);
                                  if (iVar4 != 0) {
                                    std::operator+(&local_8e0,"shading mode ",__rhs);
                                    plVar10 = (long *)std::__cxx11::string::append
                                                                ((char *)&local_8e0);
                                    psVar15 = (size_type *)(plVar10 + 2);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar10 ==
                                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)psVar15) {
                                      local_938.field_2._M_allocated_capacity = *psVar15;
                                      local_938.field_2._8_8_ = plVar10[3];
                                      local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                                    }
                                    else {
                                      local_938.field_2._M_allocated_capacity = *psVar15;
                                      local_938._M_dataplus._M_p = (pointer)*plVar10;
                                    }
                                    local_938._M_string_length = plVar10[1];
                                    *plVar10 = (long)psVar15;
                                    plVar10[1] = 0;
                                    *(undefined1 *)(plVar10 + 2) = 0;
                                    Formatter::
                                    basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    ::basic_formatter<std::__cxx11::string>
                                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                                *)local_848,&local_938);
                                    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_848);
                                    std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_848);
                                    std::ios_base::~ios_base(local_7d8);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_938._M_dataplus._M_p != &local_938.field_2) {
                                      operator_delete(local_938._M_dataplus._M_p,
                                                      local_938.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
                                      operator_delete(local_8e0._M_dataplus._M_p,
                                                      local_8e0.field_2._M_allocated_capacity + 1);
                                    }
                                  }
                                  uVar5 = 3;
                                }
                              }
                            }
                          }
                          local_914 = uVar5;
                          aiMaterial::AddBinaryProperty
                                    ((aiMaterial *)
                                     this_01.
                                     super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                     .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                     &local_914,4,"$mat.shadingm",0,0,aiPTI_Integer);
                          if (*(char *)(lVar7 + 0xc0) == '\x01') {
                            lVar7 = __dynamic_cast(*(undefined8 *)(lVar7 + 0xb0),
                                                   &STEP::EXPRESS::DataType::typeinfo,
                                                   &STEP::EXPRESS::PrimitiveDataType<double>::
                                                    typeinfo,0);
                            if (lVar7 == 0) {
                              LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5b8747);
                            }
                            else {
                              local_848._0_4_ = (undefined4)*(double *)(lVar7 + 8);
                              aiMaterial::AddBinaryProperty
                                        ((aiMaterial *)
                                         this_01.
                                         super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                         .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,
                                         local_848,4,"$mat.shininess",0,0,aiPTI_Float);
                            }
                          }
                        }
                      }
                      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                      }
                      psVar17 = psVar17 + 1;
                    } while (psVar17 != local_870);
                  }
                  _Var3._M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)local_950;
                  local_950._M_t.
                  super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                  super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                       (tuple<aiMaterial_*,_std::default_delete<aiMaterial>_>)
                       (_Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>)0x0;
                  local_438.length =
                       (ai_uint32)
                       _Var3._M_t.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
                  local_438.data._0_4_ =
                       _Var3._M_t.
                       super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                       super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl._4_4_;
                  std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                            (local_890,(aiMaterial **)&local_438);
                  ppaVar18 = (conv->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start;
                  ppaVar2 = (conv->materials).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pmVar11 = std::
                            map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                            ::operator[](local_898,&local_908);
                  puVar13 = local_888;
                  uVar16 = (int)((ulong)((long)ppaVar2 - (long)ppaVar18) >> 3) - 1;
                  unaff_RBX = (ulong)uVar16;
                  *pmVar11 = uVar16;
                  std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
                            ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_950)
                  ;
                  pIVar21 = local_880;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_900._M_dataplus._M_p != &local_900.field_2) {
                    operator_delete(local_900._M_dataplus._M_p,
                                    local_900.field_2._M_allocated_capacity + 1);
                    pIVar21 = local_880;
                  }
                }
LAB_005b87fd:
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                }
                if (pIVar21 != (IfcSurfaceStyle *)0x0) goto LAB_005b8a29;
                puVar13 = puVar13 + 2;
              } while (puVar13 != local_878);
            }
            puVar13 = local_8a0 + 1;
          } while (puVar13 != local_8b0);
        }
      }
      _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(local_8a8);
      pVar23.second._M_node = local_8b8._M_node;
      pVar23.first._M_node = _Var12._M_node;
    } while (_Var12._M_node != local_8b8._M_node);
  }
  unaff_RBX = local_8c0;
  if ((char)local_918 == '\x01' && (int)local_8c0 == -1) {
    memset(local_438.data + 0xd,0x1b,0x3f3);
    local_438.length = 0xc;
    builtin_strncpy(local_438.data,"<IFCDefault>",0xd);
    ppaVar18 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppaVar18) {
      unaff_RBX = 0;
      do {
        local_848._0_4_ = 0;
        local_848._4_4_ = local_848._4_4_ & 0xffffff00;
        memset(local_848 + 5,0x1b,0x3ff);
        aiGetMaterialString(ppaVar18[unaff_RBX],"?mat.name",0,0,(aiString *)local_848);
        if ((local_848._0_4_ == 0xc) &&
           (local_438.data._8_4_ == local_848._12_4_ &&
            CONCAT44(local_438.data._4_4_,local_438.data._0_4_) ==
            CONCAT44(local_848._8_4_,local_848._4_4_))) goto LAB_005b8a29;
        unaff_RBX = unaff_RBX + 1;
        ppaVar18 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (unaff_RBX <
               (ulong)((long)(conv->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppaVar18 >> 3));
    }
    this_02 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_02);
    local_938._M_dataplus._M_p = (pointer)this_02;
    aiMaterial::AddProperty(this_02,&local_438,"?mat.name",0,0);
    local_848._0_4_ = 0x3f19999a;
    local_848[4] = -0x66;
    local_848[5] = -0x67;
    local_848[6] = '\x19';
    local_848[7] = '?';
    local_848[8] = -0x66;
    local_848[9] = -0x67;
    local_848[10] = '\x19';
    local_848[0xb] = '?';
    local_848[0xc] = '\0';
    local_848[0xd] = '\0';
    local_848[0xe] = -0x80;
    local_848[0xf] = '?';
    aiMaterial::AddBinaryProperty(this_02,local_848,0x10,"$clr.diffuse",0,0,aiPTI_Float);
    local_8e0._M_dataplus._M_p = local_938._M_dataplus._M_p;
    local_938._M_dataplus._M_p = (pointer)0x0;
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,
               (aiMaterial **)&local_8e0);
    unaff_RBX = (ulong)((int)((ulong)((long)(conv->materials).
                                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(conv->materials).
                                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
    std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr
              ((unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_938);
  }
LAB_005b8a29:
  return (uint)unaff_RBX;
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}